

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * rbuObjIterGetOldlist(sqlite3rbu *p,RbuObjIter *pIter,char *zObj)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  
  if ((p->rc == 0) && (pIter->abIndexed != (u8 *)0x0)) {
    if (pIter->nTblCol < 1) {
LAB_001d16d6:
      pcVar1 = (char *)0x0;
    }
    else {
      lVar3 = 0;
      pcVar1 = (char *)0x0;
      pcVar2 = "";
      do {
        if (pIter->abIndexed[lVar3] == '\0') {
          pcVar1 = sqlite3_mprintf("%z%sNULL",pcVar1,pcVar2);
        }
        else {
          pcVar1 = sqlite3_mprintf("%z%s%s.\"%w\"",pcVar1,pcVar2,zObj,pIter->azTblCol[lVar3]);
        }
        if (pcVar1 == (char *)0x0) {
          p->rc = 7;
          goto LAB_001d16d6;
        }
        lVar3 = lVar3 + 1;
        pcVar2 = ", ";
      } while (lVar3 < pIter->nTblCol);
    }
    if ((pIter->eType | 2U) == 3) {
      pcVar1 = rbuMPrintf(p,"%z, %s._rowid_",pcVar1,zObj);
      return pcVar1;
    }
  }
  else {
    pcVar1 = (char *)0x0;
  }
  return pcVar1;
}

Assistant:

static char *rbuObjIterGetOldlist(
  sqlite3rbu *p, 
  RbuObjIter *pIter,
  const char *zObj
){
  char *zList = 0;
  if( p->rc==SQLITE_OK && pIter->abIndexed ){
    const char *zS = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abIndexed[i] ){
        const char *zCol = pIter->azTblCol[i];
        zList = sqlite3_mprintf("%z%s%s.\"%w\"", zList, zS, zObj, zCol);
      }else{
        zList = sqlite3_mprintf("%z%sNULL", zList, zS);
      }
      zS = ", ";
      if( zList==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
    }

    /* For a table with implicit rowids, append "old._rowid_" to the list. */
    if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
      zList = rbuMPrintf(p, "%z, %s._rowid_", zList, zObj);
    }
  }
  return zList;
}